

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::WaitStatementSyntax::setChild
          (WaitStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  size_type sVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  ExpressionSyntax *pEVar6;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar7;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  StatementSyntax *pSVar10;
  NamedLabelSyntax *pNVar11;
  logic_error *this_00;
  long *plVar12;
  size_type *psVar13;
  char *func;
  long *plVar14;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (6 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar12 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar12;
    psVar13 = (size_type *)(plVar12 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar13) {
      local_b0.field_2._M_allocated_capacity = *psVar13;
      local_b0.field_2._8_8_ = plVar12[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar13;
    }
    local_b0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x368c);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar12;
    plVar14 = plVar12 + 2;
    if (local_90 == plVar14) {
      local_80 = *plVar14;
      lStack_78 = plVar12[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar14;
    }
    local_88 = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar12;
    plVar14 = plVar12 + 2;
    if (local_f0 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar12[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar14;
    }
    local_e8 = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar11 = (NamedLabelSyntax *)0x0;
    }
    else {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pNVar11 = (NamedLabelSyntax *)*ppSVar9;
      if ((pNVar11->super_SyntaxNode).kind != NamedLabel) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,"T &slang::syntax::SyntaxNode::as() [T = slang::syntax::NamedLabelSyntax]")
        ;
      }
    }
    (this->super_StatementSyntax).label = pNVar11;
    break;
  case 1:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar7 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar9);
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar7->super_SyntaxListBase).childCount;
    sVar2 = (pSVar7->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar7->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar2;
    break;
  case 2:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar1 = pvVar8->info;
    (this->wait).kind = pvVar8->kind;
    (this->wait).field_0x2 = uVar3;
    (this->wait).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->wait).rawLen = uVar5;
    (this->wait).info = pIVar1;
    break;
  case 3:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar1 = pvVar8->info;
    (this->openParen).kind = pvVar8->kind;
    (this->openParen).field_0x2 = uVar3;
    (this->openParen).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->openParen).rawLen = uVar5;
    (this->openParen).info = pIVar1;
    break;
  case 4:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      func = 
      "slang::not_null<slang::syntax::ExpressionSyntax *>::not_null(U &&) [T = slang::syntax::ExpressionSyntax *, U = slang::syntax::ExpressionSyntax *]"
      ;
LAB_00300251:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,func);
    }
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pEVar6 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(*ppSVar9);
    (this->expr).ptr = pEVar6;
    break;
  case 5:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar1 = pvVar8->info;
    (this->closeParen).kind = pvVar8->kind;
    (this->closeParen).field_0x2 = uVar3;
    (this->closeParen).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->closeParen).rawLen = uVar5;
    (this->closeParen).info = pIVar1;
    break;
  case 6:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      func = 
      "slang::not_null<slang::syntax::StatementSyntax *>::not_null(U &&) [T = slang::syntax::StatementSyntax *, U = slang::syntax::StatementSyntax *]"
      ;
      goto LAB_00300251;
    }
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar10 = SyntaxNode::as<slang::syntax::StatementSyntax>(*ppSVar9);
    (this->statement).ptr = pSVar10;
  }
  return;
}

Assistant:

void WaitStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: wait = child.token(); return;
        case 3: openParen = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 5: closeParen = child.token(); return;
        case 6: statement = child.node() ? &child.node()->as<StatementSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}